

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# te.hpp
# Opt level: O2

void __thiscall
te::v1::poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable>::poly<Circle,0ul>
          (poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable> *this,Circle *t)

{
  std::make_unique<void*[]>((size_t)this);
  dynamic_storage::dynamic_storage<Circle>((dynamic_storage *)(this + 8),t);
  **(undefined8 **)this =
       init<1ul,Circle,Drawable::draw(std::ostream&)const::{lambda(void*,std::ostream&)#1}(auto:1_const&,auto:2&)#1},std::ostream&>(te::v1::detail::type_list<Drawable::draw(std::ostream&)const::{lambda(void*,std::ostream&)#1}(auto:1_const&,auto:2&)#1},std::ostream&>)
       ::{lambda(void*,std::ostream&)#1}::ostream__;
  return;
}

Assistant:

constexpr poly(T &&t, std::index_sequence<Ns...>)
      : vtable{sizeof...(Ns)}, storage{std::forward<T>(t)} {
    static_assert(sizeof...(Ns) > 0);
    (init<Ns + 1, T>(decltype(get(detail::mappings<I, Ns + 1>{})){}), ...);
  }